

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

int ddCheckPermuation(DdManager *table,MtrNode *treenode,int *perm,int *invperm)

{
  int iVar1;
  int local_48;
  int local_44;
  int maxLevel;
  int minLevel;
  int level;
  int index;
  int size;
  int i;
  int *invperm_local;
  int *perm_local;
  MtrNode *treenode_local;
  DdManager *table_local;
  
  if (treenode == (MtrNode *)0x0) {
    table_local._4_4_ = 1;
  }
  else {
    local_44 = table->size;
    local_48 = 0;
    for (index = treenode->low; (uint)index < treenode->low + treenode->size; index = index + 1) {
      iVar1 = perm[table->invperm[index]];
      if (iVar1 < local_44) {
        local_44 = iVar1;
      }
      if (local_48 < iVar1) {
        local_48 = iVar1;
      }
    }
    if ((local_48 - local_44) + 1U == treenode->size) {
      if ((treenode->child == (MtrNode *)0x0) ||
         (iVar1 = ddCheckPermuation(table,treenode->child,perm,invperm), iVar1 != 0)) {
        if ((treenode->younger == (MtrNode *)0x0) ||
           (iVar1 = ddCheckPermuation(table,treenode->younger,perm,invperm), iVar1 != 0)) {
          table_local._4_4_ = 1;
        }
        else {
          table_local._4_4_ = 0;
        }
      }
      else {
        table_local._4_4_ = 0;
      }
    }
    else {
      table_local._4_4_ = 0;
    }
  }
  return table_local._4_4_;
}

Assistant:

static int
ddCheckPermuation(
  DdManager * table,
  MtrNode * treenode,
  int * perm,
  int * invperm)
{
    int i, size;
    int index, level, minLevel, maxLevel;

    if (treenode == NULL) return(1);

    minLevel = table->size;
    maxLevel = 0;
    /* i : level */
    for (i = treenode->low; i < treenode->low + treenode->size; i++) {
        index = table->invperm[i];
        level = perm[index];
        if (level < minLevel)
            minLevel = level;
        if (level > maxLevel)
            maxLevel = level;
    }
    size = maxLevel - minLevel + 1;
    if (size != treenode->size)
        return(0);

    if (treenode->child != NULL) {
        if (!ddCheckPermuation(table, treenode->child, perm, invperm))
            return(0);
    }
    if (treenode->younger != NULL) {
        if (!ddCheckPermuation(table, treenode->younger, perm, invperm))
            return(0);
    }
    return(1);
}